

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

float __thiscall
MinVR::VRDataIndex::getValueWithDefault<float>
          (VRDataIndex *this,string *key,float *defaultVal,string *nameSpace,bool inherit)

{
  bool bVar1;
  pointer ppVar2;
  VRDatum *pVVar3;
  string *in_RCX;
  VRFloat *in_RDX;
  byte in_R8B;
  iterator p;
  bool in_stack_00000127;
  string *in_stack_00000128;
  string *in_stack_00000130;
  VRDataIndex *in_stack_00000138;
  _Self local_78;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  local_70 [3];
  string local_58 [32];
  iterator local_38;
  byte local_29;
  VRFloat *local_20;
  VRFloat local_4;
  
  local_29 = in_R8B & 1;
  local_20 = in_RDX;
  std::__cxx11::string::string(local_58,in_RCX);
  local_38._M_node =
       (_Base_ptr)_getEntry(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000127)
  ;
  std::__cxx11::string::~string(local_58);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_const_iterator(local_70,&local_38);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              *)in_RCX);
  bVar1 = std::operator==(local_70,&local_78);
  if (bVar1) {
    local_4 = *local_20;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                           *)0x12fa79);
    pVVar3 = VRDatumPtr::operator->(&ppVar2->second);
    (*pVVar3->_vptr_VRDatum[3])();
    local_4 = VRDatumConverter::operator_cast_to_float((VRDatumConverter<MinVR::VRDatum> *)0x12fa9d)
    ;
  }
  return local_4;
}

Assistant:

T getValueWithDefault(const std::string &key,
                        const T &defaultVal,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      return defaultVal;
    } else {
      return p->second->getValue();
    }
  }